

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O3

Fl_Menu_Item * __thiscall Fl_Menu_Item::test_shortcut(Fl_Menu_Item *this)

{
  int iVar1;
  Fl_Menu_Item *pFVar2;
  
  if (this->text == (char *)0x0) {
    return (Fl_Menu_Item *)0x0;
  }
  pFVar2 = (Fl_Menu_Item *)0x0;
  do {
    if ((this->flags & 1) == 0) {
      iVar1 = Fl::test_shortcut(this->shortcut_);
      if (iVar1 != 0) {
        return this;
      }
      if (pFVar2 == (Fl_Menu_Item *)0x0) {
        if ((this->flags & 0x60U) == 0) {
          pFVar2 = (Fl_Menu_Item *)0x0;
        }
        else {
          if ((this->flags & 0x40U) == 0) {
            pFVar2 = (Fl_Menu_Item *)this->user_data_;
          }
          else {
            pFVar2 = this + 1;
          }
          pFVar2 = test_shortcut(pFVar2);
        }
      }
    }
    iVar1 = 0;
    do {
      if (this->text == (char *)0x0) {
        if (iVar1 == 0) {
          return pFVar2;
        }
        iVar1 = iVar1 + -1;
      }
      else {
        iVar1 = iVar1 + (uint)(((uint)this->flags >> 6 & 1) != 0);
      }
      this = this + 1;
    } while (iVar1 != 0);
  } while (this->text != (char *)0x0);
  return pFVar2;
}

Assistant:

const Fl_Menu_Item* Fl_Menu_Item::test_shortcut() const {
  const Fl_Menu_Item* m = this;
  const Fl_Menu_Item* ret = 0;
  if (m) for (; m->text; m = next_visible_or_not(m)) {
    if (m->active()) {
      // return immediately any match of an item in top level menu:
      if (Fl::test_shortcut(m->shortcut_)) return m;
      // if (Fl_Widget::test_shortcut(m->text)) return m;
      // only return matches from lower menu if nothing found in top menu:
      if (!ret && m->submenu()) {
	const Fl_Menu_Item* s =
	  (m->flags&FL_SUBMENU) ? m+1:(const Fl_Menu_Item*)m->user_data_;
	ret = s->test_shortcut();
      }
    }
  }
  return ret;
}